

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameParseCleanup(Parse *pParse)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->pVdbe != (Vdbe *)0x0) {
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db_00,pParse->pNewTable);
  if (pParse->pNewIndex != (Index *)0x0) {
    sqlite3FreeIndex(db_00,pParse->pNewIndex);
  }
  sqlite3DeleteTrigger(db_00,pParse->pNewTrigger);
  sqlite3DbFree(db_00,pParse->zErrMsg);
  renameTokenFree(db_00,pParse->pRename);
  sqlite3ParserReset(pParse);
  return;
}

Assistant:

static void renameParseCleanup(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( pParse->pVdbe ){
    sqlite3VdbeFinalize(pParse->pVdbe);
  }
  sqlite3DeleteTable(db, pParse->pNewTable);
  if( pParse->pNewIndex ) sqlite3FreeIndex(db, pParse->pNewIndex);
  sqlite3DeleteTrigger(db, pParse->pNewTrigger);
  sqlite3DbFree(db, pParse->zErrMsg);
  renameTokenFree(db, pParse->pRename);
  sqlite3ParserReset(pParse);
}